

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_storage.cpp
# Opt level: O2

void __thiscall libtorrent::file_storage::sanitize_symlinks(file_storage *this)

{
  pointer pfVar1;
  pointer pfVar2;
  pointer pbVar3;
  size_t sVar4;
  libtorrent *this_00;
  bool bVar5;
  pointer psVar6;
  bool bVar7;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> sVar8;
  ulong uVar9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var10;
  mapped_type *pmVar11;
  size_type sVar12;
  ulong uVar13;
  iterator iVar14;
  pointer psVar15;
  iterator iVar16;
  size_type sVar17;
  size_type sVar18;
  bool bVar19;
  pointer pcVar20;
  pointer pfVar21;
  char *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  pointer pbVar22;
  file_index_t fVar23;
  pointer pfVar24;
  size_t in_R8;
  char *in_R9;
  string_view f;
  string_view leaf;
  string_view p_00;
  string_view p_01;
  string_view lhs;
  string_view p_02;
  string_view rhs;
  string target_2;
  string target;
  string_view pv;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> i;
  undefined4 uStack_134;
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>
  symlinks_to_validate;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  dir_links;
  size_t local_c0;
  char *local_b8;
  unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  dir_map;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>_>
  file_map;
  
  file_map._M_h._M_buckets = &file_map._M_h._M_single_bucket;
  file_map._M_h._M_bucket_count = 1;
  file_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  file_map._M_h._M_element_count = 0;
  file_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  file_map._M_h._M_rehash_policy._M_next_resize = 0;
  file_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  dir_map._M_h._M_buckets = &dir_map._M_h._M_single_bucket;
  dir_map._M_h._M_bucket_count = 1;
  dir_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  dir_map._M_h._M_element_count = 0;
  dir_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  dir_map._M_h._M_rehash_policy._M_next_resize = 0;
  dir_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  dir_links._M_h._M_buckets = &dir_links._M_h._M_single_bucket;
  dir_links._M_h._M_bucket_count = 1;
  dir_links._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  dir_links._M_h._M_element_count = 0;
  dir_links._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  dir_links._M_h._M_rehash_policy._M_next_resize = 0;
  dir_links._M_h._M_single_bucket = (__node_base_ptr)0x0;
  symlinks_to_validate.
  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  symlinks_to_validate.
  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  symlinks_to_validate.
  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pfVar1 = (this->m_files).
           super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>.
           super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pfVar21 = (this->m_files).
            super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>.
            super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar13 = 0;
  bVar19 = false;
  bVar7 = false;
  do {
    psVar6 = symlinks_to_validate.
             super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (uVar13 == (((long)pfVar1 - (long)pfVar21) / 0x28 & 0xffffffffU)) {
      psVar15 = symlinks_to_validate.
                super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (psVar15 == psVar6) {
          ::std::
          _Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>
          ::~_Vector_base(&symlinks_to_validate.
                           super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>
                         );
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable(&dir_links._M_h);
          ::std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&dir_map._M_h);
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable(&file_map._M_h);
          return;
        }
        fVar23.m_val = psVar15->m_val;
        pfVar1 = (this->m_files).
                 super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                 .
                 super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pfVar21 = pfVar1;
        ::std::__cxx11::string::string
                  ((string *)&target_2,
                   (string *)
                   ((long)&(((this->m_symlinks).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                   (ulong)((*(ushort *)&pfVar1[fVar23.m_val].field_0x6 & 0x7fff) << 5)));
        target._M_string_length = target._M_string_length & 0xffffffff00000000;
        target.field_2._M_allocated_capacity = 0;
        target.field_2._8_8_ = &target._M_string_length;
        p_01._M_str = (char *)pfVar21;
        p_01._M_len = (size_t)target_2._M_dataplus._M_p;
        lsplit_path((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                     *)&pv,(libtorrent *)target_2._M_string_length,p_01);
        while( true ) {
          local_148._M_len = pv._M_len;
          local_148._M_str = pv._M_str;
          if (target_2._M_string_length <= pv._M_len) break;
          ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)&pv,&local_148,(allocator<char> *)&i);
          _i = pv._M_str;
          sVar12 = ::std::
                   _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::count(&dir_map._M_h,(key_type *)&i);
          if (sVar12 == 0) {
            iVar16 = ::std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&dir_links._M_h,(string *)&pv);
            if ((iVar16.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                 ._M_cur == (__node_type *)0x0) ||
               (sVar17 = ::std::
                         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&target,(string *)&pv), sVar17 != 0)) {
              ::std::__cxx11::string::~string((string *)&pv);
              goto LAB_001af653;
            }
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&target,(string *)&pv);
            sVar4 = *(size_t *)
                     ((long)iVar16.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                            ._M_cur + 0x28);
            this_00 = *(libtorrent **)
                       ((long)iVar16.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                              ._M_cur + 0x30);
            ::std::__cxx11::string::substr((ulong)&local_c0,(ulong)&target_2);
            lhs._M_str = local_b8;
            lhs._M_len = sVar4;
            rhs._M_str = in_R9;
            rhs._M_len = local_c0;
            in_R8 = local_c0;
            combine_path_abi_cxx11_((string *)&i,this_00,lhs,rhs);
            ::std::__cxx11::string::operator=((string *)&target_2,(string *)&i);
            ::std::__cxx11::string::~string((string *)&i);
            ::std::__cxx11::string::~string((string *)&local_c0);
            local_148._M_len = 0;
            local_148._M_str = (char *)0x0;
          }
          ::std::__cxx11::string::~string((string *)&pv);
          p_02._M_str = (char *)(local_148._M_len + 1);
          p_02._M_len = (size_t)target_2._M_dataplus._M_p;
          lsplit_path((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       *)&pv,(libtorrent *)target_2._M_string_length,p_02,in_R8);
        }
        sVar18 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::count(&file_map._M_h,&target_2);
        if (sVar18 == 0) {
          pv._M_len = target_2._M_string_length;
          pv._M_str = target_2._M_dataplus._M_p;
          sVar12 = ::std::
                   _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::count(&dir_map._M_h,(key_type *)&pv);
          if (sVar12 == 0) {
LAB_001af653:
            internal_file_path_abi_cxx11_((string *)&pv,this,fVar23);
            ::std::__cxx11::string::operator=
                      ((string *)
                       ((long)&(((this->m_symlinks).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       (ulong)((*(ushort *)&pfVar1[fVar23.m_val].field_0x6 & 0x7fff) << 5)),
                       (string *)&pv);
            ::std::__cxx11::string::~string((string *)&pv);
          }
        }
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&target);
        ::std::__cxx11::string::~string((string *)&target_2);
        psVar15 = psVar15 + 1;
      } while( true );
    }
    sVar8.m_val = (int)uVar13;
    i.m_val = sVar8.m_val;
    pfVar24 = (this->m_files).
              super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
              .
              super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (*(long *)&pfVar24[uVar13].field_0x8 < 0) {
      if (!bVar7) {
        pfVar2 = (this->m_files).
                 super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                 .
                 super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (fVar23.m_val = 0; (int)(((long)pfVar2 - (long)pfVar24) / 0x28) != fVar23.m_val;
            fVar23.m_val = fVar23.m_val + 1) {
          internal_file_path_abi_cxx11_(&target_2,this,fVar23);
          target._M_string_length = target_2._M_string_length;
          target._M_dataplus._M_p = (pointer)&target.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)target_2._M_dataplus._M_p == &target_2.field_2) {
            target.field_2._12_4_ = target_2.field_2._12_4_;
            target.field_2._8_4_ = target_2.field_2._8_4_;
          }
          else {
            target._M_dataplus = target_2._M_dataplus;
          }
          target.field_2._M_allocated_capacity._4_4_ = target_2.field_2._M_allocated_capacity._4_4_;
          target.field_2._M_allocated_capacity._0_4_ = target_2.field_2._M_allocated_capacity._0_4_;
          target_2._M_string_length = 0;
          target_2.field_2._M_allocated_capacity._0_4_ =
               target_2.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
          target_2._M_dataplus._M_p = (pointer)&target_2.field_2;
          ::std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,std::allocator<std::pair<std::__cxx11::string_const,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::pair<std::__cxx11::string_const,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,std::allocator<std::pair<std::__cxx11::string_const,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&file_map,&target);
          ::std::__cxx11::string::~string((string *)&target);
          ::std::__cxx11::string::~string((string *)&target_2);
        }
        pfVar24 = (this->m_files).
                  super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                  .
                  super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        sVar8.m_val = i.m_val;
      }
      ::std::__cxx11::string::string
                ((string *)&target,
                 (string *)
                 ((long)&(((this->m_symlinks).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                 (ulong)((*(ushort *)&pfVar24[sVar8.m_val].field_0x6 & 0x7fff) << 5)));
      f._M_str = extraout_RDX;
      f._M_len = (size_t)target._M_dataplus._M_p;
      bVar7 = is_complete((libtorrent *)target._M_string_length,f);
      if (bVar7) {
        internal_file_path_abi_cxx11_(&target_2,this,(file_index_t)i.m_val);
        ::std::__cxx11::string::operator=
                  ((string *)
                   ((long)&(((this->m_symlinks).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                   (ulong)((*(ushort *)&pfVar24[sVar8.m_val].field_0x6 & 0x7fff) << 5)),
                   (string *)&target_2);
LAB_001af02e:
        ::std::__cxx11::string::~string((string *)&target_2);
LAB_001af089:
        bVar5 = false;
      }
      else {
        iVar14 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&file_map._M_h,&target);
        if (iVar14.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_true>
            ._M_cur != (__node_type *)0x0) {
          ::std::__cxx11::string::_M_assign
                    ((string *)
                     ((long)&(((this->m_symlinks).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     (ulong)((*(ushort *)&pfVar24[sVar8.m_val].field_0x6 & 0x7fff) << 5)));
          if (*(long *)&(this->m_files).
                        super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                        .
                        super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                        ._M_impl.super__Vector_impl_data._M_start
                        [*(int *)((long)iVar14.
                                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_true>
                                        ._M_cur + 0x28)].field_0x8 < 0) {
            internal_file_path_abi_cxx11_(&target_2,this,(file_index_t)i.m_val);
            pmVar11 = ::std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&dir_links,&target_2);
            ::std::__cxx11::string::_M_assign((string *)pmVar11);
            goto LAB_001af02e;
          }
          goto LAB_001af089;
        }
        if (!bVar19) {
          pbVar3 = (this->m_paths).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar22 = (this->m_paths).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pbVar22 != pbVar3;
              pbVar22 = pbVar22 + 1) {
            pcVar20 = (pbVar22->_M_dataplus)._M_p;
            pv._M_len = pbVar22->_M_string_length;
            pv._M_str = pcVar20;
            while (pv._M_len != 0) {
              ::std::__detail::
              _Insert_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::insert((_Insert_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        *)&dir_map,&pv);
              p_00._M_str = pcVar20;
              p_00._M_len = (size_t)pv._M_str;
              rsplit_path((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                           *)&target_2,(libtorrent *)pv._M_len,p_00);
              pv._M_str = (char *)target_2._M_string_length;
              pv._M_len = (size_t)target_2._M_dataplus._M_p;
            }
          }
        }
        target_2._M_dataplus._M_p = (pointer)target._M_string_length;
        target_2._M_string_length = (size_type)target._M_dataplus._M_p;
        sVar12 = ::std::
                 _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count(&dir_map._M_h,(key_type *)&target_2);
        bVar19 = true;
        if (sVar12 != 0) {
          ::std::__cxx11::string::_M_assign
                    ((string *)
                     ((long)&(((this->m_symlinks).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     (ulong)((*(ushort *)&pfVar24[sVar8.m_val].field_0x6 & 0x7fff) << 5)));
          internal_file_path_abi_cxx11_(&target_2,this,(file_index_t)i.m_val);
          pmVar11 = ::std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&dir_links,&target_2);
          ::std::__cxx11::string::_M_assign((string *)pmVar11);
          goto LAB_001af02e;
        }
        bVar5 = true;
      }
      ::std::__cxx11::string::~string((string *)&target);
      bVar7 = true;
      if (bVar5) {
        uVar9 = (ulong)pfVar24[sVar8.m_val].path_index.m_val;
        if (uVar9 < 0x3ffffffe) {
          ::std::__cxx11::string::string
                    ((string *)&target,
                     (string *)
                     ((this->m_paths).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar9));
          pbVar22 = (this->m_symlinks).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar9 = (ulong)((*(ushort *)&pfVar24[sVar8.m_val].field_0x6 & 0x7fff) << 5);
          leaf._M_str = (char *)pbVar22;
          leaf._M_len = *(size_t *)((long)&(pbVar22->_M_dataplus)._M_p + uVar9);
          append_path((libtorrent *)&target,*(string **)((long)&pbVar22->_M_string_length + uVar9),
                      leaf);
          _Var10 = ::std::
                   __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                             ((this->m_paths).
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (this->m_paths).
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,&target);
          if (_Var10._M_current ==
              (this->m_paths).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            target_2._M_dataplus._M_p = (pointer)target._M_string_length;
            target_2._M_string_length = (size_type)target._M_dataplus._M_p;
            sVar12 = ::std::
                     _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::count(&dir_map._M_h,(key_type *)&target_2);
            if (sVar12 != 0) {
              ::std::__cxx11::string::_M_assign
                        ((string *)
                         ((long)&(((this->m_symlinks).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         (ulong)((*(ushort *)&pfVar24[sVar8.m_val].field_0x6 & 0x7fff) << 5)));
              internal_file_path_abi_cxx11_(&target_2,this,(file_index_t)i.m_val);
              pmVar11 = ::std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&dir_links,&target_2);
              ::std::__cxx11::string::_M_assign((string *)pmVar11);
              goto LAB_001af2ed;
            }
            iVar14 = ::std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&file_map._M_h,&target);
            if (iVar14.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              ::std::__cxx11::string::~string((string *)&target);
              goto LAB_001af39a;
            }
            ::std::__cxx11::string::_M_assign
                      ((string *)
                       ((long)&(((this->m_symlinks).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       (ulong)((*(ushort *)&pfVar24[sVar8.m_val].field_0x6 & 0x7fff) << 5)));
            if (*(long *)&(this->m_files).
                          super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                          .
                          super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                          ._M_impl.super__Vector_impl_data._M_start
                          [*(int *)((long)iVar14.
                                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_true>
                                          ._M_cur + 0x28)].field_0x8 < 0) {
              internal_file_path_abi_cxx11_(&target_2,this,(file_index_t)i.m_val);
              pmVar11 = ::std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&dir_links,&target_2);
              ::std::__cxx11::string::_M_assign((string *)pmVar11);
              goto LAB_001af2ed;
            }
          }
          else {
            ::std::__cxx11::string::_M_assign
                      ((string *)
                       ((long)&(((this->m_symlinks).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       (ulong)((*(ushort *)&pfVar24[sVar8.m_val].field_0x6 & 0x7fff) << 5)));
            internal_file_path_abi_cxx11_(&target_2,this,(file_index_t)i.m_val);
            pmVar11 = ::std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&dir_links,&target_2);
            ::std::__cxx11::string::_M_assign((string *)pmVar11);
LAB_001af2ed:
            ::std::__cxx11::string::~string((string *)&target_2);
          }
          ::std::__cxx11::string::~string((string *)&target);
        }
        else {
LAB_001af39a:
          internal_file_path_abi_cxx11_(&target,this,(file_index_t)i.m_val);
          pmVar11 = ::std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&dir_links,&target);
          ::std::__cxx11::string::_M_assign((string *)pmVar11);
          ::std::__cxx11::string::~string((string *)&target);
          ::std::
          vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>
          ::push_back(&symlinks_to_validate,&i);
        }
      }
    }
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

void file_storage::sanitize_symlinks()
	{
		// symlinks are unusual, this function is optimized assuming there are no
		// symbolic links in the torrent. If we find one symbolic link, we'll
		// build the hash table of files it's allowed to refer to, but don't pay
		// that price up-front.
		std::unordered_map<std::string, file_index_t> file_map;
		bool file_map_initialized = false;

		// lazily instantiated set of all valid directories a symlink may point to
		std::unordered_set<string_view> dir_map;
		bool dir_map_initialized = false;

		// symbolic links that points to directories
		std::unordered_map<std::string, std::string> dir_links;

		// we validate symlinks in (potentially) 2 passes over the files.
		// remaining symlinks to validate after the first pass
		std::vector<file_index_t> symlinks_to_validate;

		for (auto const i : file_range())
		{
			if (!(file_flags(i) & file_storage::flag_symlink)) continue;

			if (!file_map_initialized)
			{
				for (auto const j : file_range())
					file_map.insert({internal_file_path(j), j});
				file_map_initialized = true;
			}

			aux::file_entry const& fe = m_files[i];
			TORRENT_ASSERT(fe.symlink_index < int(m_symlinks.size()));

			// symlink targets are only allowed to point to files or directories in
			// this torrent.
			{
				std::string target = m_symlinks[fe.symlink_index];

				if (is_complete(target))
				{
					// a symlink target is not allowed to be an absolute path, ever
					// this symlink is invalid, make it point to itself
					m_symlinks[fe.symlink_index] = internal_file_path(i);
					continue;
				}

				auto const iter = file_map.find(target);
				if (iter != file_map.end())
				{
					m_symlinks[fe.symlink_index] = target;
					if (file_flags(iter->second) & file_storage::flag_symlink)
					{
						// we don't know whether this symlink is a file or a
						// directory, so make the conservative assumption that it's a
						// directory
						dir_links[internal_file_path(i)] = target;
					}
					continue;
				}

				// it may point to a directory that doesn't have any files (but only
				// other directories), in which case it won't show up in m_paths
				if (!dir_map_initialized)
				{
					for (auto const& p : m_paths)
						for (string_view pv = p; !pv.empty(); pv = rsplit_path(pv).first)
							dir_map.insert(pv);
					dir_map_initialized = true;
				}

				if (dir_map.count(target))
				{
					// it points to a sub directory within the torrent, that's OK
					m_symlinks[fe.symlink_index] = target;
					dir_links[internal_file_path(i)] = target;
					continue;
				}

			}

			// for backwards compatibility, allow paths relative to the link as
			// well
			if (fe.path_index < aux::file_entry::path_is_absolute)
			{
				std::string target = m_paths[fe.path_index];
				append_path(target, m_symlinks[fe.symlink_index]);
				// if it points to a directory, that's OK
				auto const it = std::find(m_paths.begin(), m_paths.end(), target);
				if (it != m_paths.end())
				{
					m_symlinks[fe.symlink_index] = *it;
					dir_links[internal_file_path(i)] = *it;
					continue;
				}

				if (dir_map.count(target))
				{
					// it points to a sub directory within the torrent, that's OK
					m_symlinks[fe.symlink_index] = target;
					dir_links[internal_file_path(i)] = target;
					continue;
				}

				auto const iter = file_map.find(target);
				if (iter != file_map.end())
				{
					m_symlinks[fe.symlink_index] = target;
					if (file_flags(iter->second) & file_storage::flag_symlink)
					{
						// we don't know whether this symlink is a file or a
						// directory, so make the conservative assumption that it's a
						// directory
						dir_links[internal_file_path(i)] = target;
					}
					continue;
				}
			}

			// we don't know whether this symlink is a file or a
			// directory, so make the conservative assumption that it's a
			// directory
			dir_links[internal_file_path(i)] = m_symlinks[fe.symlink_index];
			symlinks_to_validate.push_back(i);
		}

		// in case there were some "complex" symlinks, we nee a second pass to
		// validate those. For example, symlinks whose target rely on other
		// symlinks
		for (auto const i : symlinks_to_validate)
		{
			aux::file_entry const& fe = m_files[i];
			TORRENT_ASSERT(fe.symlink_index < int(m_symlinks.size()));

			std::string target = m_symlinks[fe.symlink_index];

			// to avoid getting stuck in an infinite loop, we only allow traversing
			// a symlink once
			std::set<std::string> traversed;

			// this is where we check every path element for existence. If it's not
			// among the concrete paths, it may be a symlink, which is also OK
			// note that we won't iterate through this for the last step, where the
			// filename is included. The filename is validated after the loop
			for (string_view branch = lsplit_path(target).first;
				branch.size() < target.size();
				branch = lsplit_path(target, branch.size() + 1).first)
			{
				std::string branch_temp(branch);
				// this is a concrete directory
				if (dir_map.count(branch_temp)) continue;
				auto const iter = dir_links.find(branch_temp);
				if (iter == dir_links.end()) goto failed;
				if (traversed.count(branch_temp)) goto failed;
				traversed.insert(std::move(branch_temp));

				// this path element is a symlink. substitute the branch so far by
				// the link target
				target = combine_path(iter->second, target.substr(branch.size() + 1));

				// start over with the new (concrete) path
				branch = {};
			}

			// the final (resolved) target must be a valid file
			// or directory
			if (file_map.count(target) == 0
				&& dir_map.count(target) == 0) goto failed;

			// this is OK
			continue;

failed:

			// this symlink is invalid, make it point to itself
			m_symlinks[fe.symlink_index] = internal_file_path(i);
		}
	}